

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::NewMessage(FlowBuffer *this)

{
  int iVar1;
  
  iVar1 = 0;
  if (this->buffer_n_ == 0) {
    if (this->mode_ == FRAME_MODE) {
      iVar1 = this->frame_length_;
    }
    else if (this->mode_ == CR_OR_LF_1) {
      iVar1 = this->frame_length_ + (uint)(this->linebreak_style_ == STRICT_CRLF) + 1;
    }
  }
  this->orig_data_begin_ = this->orig_data_begin_ + iVar1;
  this->buffer_n_ = 0;
  this->message_complete_ = false;
  ContractBuffer(this);
  return;
}

Assistant:

void FlowBuffer::NewMessage()
	{
	BINPAC_ASSERT(frame_length_ >= 0);

	int bytes_to_advance = 0;
	if ( buffer_n_ == 0 )
		{
		switch ( mode_ )
			{
			case LINE_MODE:
				bytes_to_advance = (frame_length_ + (linebreak_style_ == STRICT_CRLF ? 2 : 1));
				break;
			case FRAME_MODE:
				bytes_to_advance = frame_length_;
				break;
			case UNKNOWN_MODE:
				break;
			}
		}

	orig_data_begin_ += bytes_to_advance;
	BINPAC_ASSERT(orig_data_begin_ <= orig_data_end_);

	buffer_n_ = 0;
	message_complete_ = false;
	ContractBuffer();
	}